

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O3

int pkey_gost_mac_signctx_init(EVP_PKEY_CTX *ctx,EVP_MD_CTX *mctx)

{
  void *pvVar1;
  
  pvVar1 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
  if (pvVar1 == (void *)0x0) {
    pkey_gost_mac_init(ctx);
  }
  pvVar1 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
  if (pvVar1 == (void *)0x0) {
    ERR_GOST_error(0x83,0x79,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_pmeth.c"
                   ,0x3cc);
  }
  return (uint)(pvVar1 != (void *)0x0);
}

Assistant:

static int pkey_gost_mac_signctx_init(EVP_PKEY_CTX *ctx, EVP_MD_CTX *mctx)
{
    struct gost_mac_pmeth_data *data = EVP_PKEY_CTX_get_data(ctx);

    if (data == NULL) {
        pkey_gost_mac_init(ctx);
    }

    data = EVP_PKEY_CTX_get_data(ctx);
    if (!data) {
        GOSTerr(GOST_F_PKEY_GOST_MAC_SIGNCTX_INIT, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }

    return 1;
}